

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O3

void __thiscall TcpConn::OnData(TcpConn *this)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  ssize_t sVar4;
  undefined4 extraout_var_00;
  long *plVar5;
  int *piVar6;
  long lVar7;
  ostream *this_01;
  size_t in_RCX;
  BufferChain *this_00;
  
  iVar2 = (*(this->super_PollObj)._vptr_PollObj[9])();
  this_00 = (BufferChain *)CONCAT44(extraout_var,iVar2);
  pcVar3 = BufferChain::GetWriteAddr(this_00);
  uVar1 = BufferChain::GetCanWriteCount(this_00);
  sVar4 = TcpSocket::read(&this->m_socket,(int)pcVar3,(void *)(ulong)uVar1,in_RCX);
  iVar2 = (int)sVar4;
  if (-1 < iVar2) {
    do {
      if ((int)sVar4 == 0) {
        Buffer::AddReaChain(&this->super_Buffer,this_00);
        this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::__ostream_insert<char,std::char_traits<char>>(this_01,":",1);
        piVar6 = __errno_location();
        iVar2 = *piVar6;
        goto LAB_0010462e;
      }
      this_00->write = this_00->write + (short)sVar4;
      uVar1 = BufferChain::GetCanWriteCount(this_00);
      if (uVar1 == 0) {
        Buffer::AddReaChain(&this->super_Buffer,this_00);
        iVar2 = (*(this->super_PollObj)._vptr_PollObj[9])(this);
        this_00 = (BufferChain *)CONCAT44(extraout_var_00,iVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"read ",5);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,(int)sVar4);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      pcVar3 = BufferChain::GetWriteAddr(this_00);
      uVar1 = BufferChain::GetCanWriteCount(this_00);
      sVar4 = TcpSocket::read(&this->m_socket,(int)pcVar3,(void *)(ulong)uVar1,in_RCX);
      iVar2 = (int)sVar4;
    } while (-1 < iVar2);
  }
  Buffer::AddReaChain(&this->super_Buffer,this_00);
  piVar6 = __errno_location();
  if (*piVar6 == 0xb) {
    TmpSend(this);
    lVar7 = 0x38;
  }
  else {
    this_01 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(this_01,":",1);
    iVar2 = *piVar6;
LAB_0010462e:
    plVar5 = (long *)std::ostream::operator<<(this_01,iVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    lVar7 = 0x40;
  }
  (**(code **)((long)(this->super_PollObj)._vptr_PollObj + lVar7))(this);
  return;
}

Assistant:

void TcpConn::OnData()
{
    BufferChain* buff = this->Alloc();
    while (true)
    {    
        //TODO最后一次内存泄漏
        //既然用了et 这里要改 要一次性读完
        int ret = m_socket.read(buff->GetWriteAddr(), buff->GetCanWriteCount());
        if(ret < 0)
        {
            this->AddReaChain(buff);
            if(errno == EAGAIN || errno == EWOULDBLOCK)
            {
                break;
            }
            else
            {
                std::cout << ret << ":" << errno << std::endl;
                this->OnConnError();
                return;
            }
        }
        else if(ret == 0)
        {
            this->AddReaChain(buff);
            std::cout << ret << ":" << errno << std::endl;
            this->OnConnError();
            return;
        }
        buff->write += ret;
        if(buff->GetCanWriteCount() == 0)
        {
            this->AddReaChain(buff);
            buff = this->Alloc();
        }
        std::cout << "read " << ret << std::endl;

    }

    this->TmpSend();
    this->OnConnData();
}